

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O2

void __thiscall
enact::WhileExpr::WhileExpr
          (WhileExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *condition,
          unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *body,Token *keyword)

{
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__WhileExpr_001242e0;
  (this->condition)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl =
       (condition->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
       super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
       super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (condition->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->body)._M_t.super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>.
  _M_t.super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
  super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl =
       (body->_M_t).super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>.
       _M_t.super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
       super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
  (body->_M_t).super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
  super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
  super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl = (BlockExpr *)0x0;
  Token::Token(&this->keyword,keyword);
  return;
}

Assistant:

WhileExpr(std::unique_ptr<Expr> condition, std::unique_ptr<BlockExpr> body, Token keyword) :
                condition{std::move(condition)},
                body{std::move(body)},
                keyword{std::move(keyword)} {}